

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builtins.h
# Opt level: O3

void __thiscall
slang::ast::builtins::Builtins::addSystemSubroutine
          (Builtins *this,shared_ptr<slang::ast::SystemSubroutine> *subroutine)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  KnownSystemName KVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer psVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  byte bVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  byte bVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  byte bVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  byte bVar23;
  value_type *pvVar24;
  undefined8 __n;
  undefined8 __s1;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  byte bVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  byte bVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  byte bVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  byte bVar40;
  int iVar41;
  uint uVar42;
  SystemSubroutine *__tmp;
  ulong uVar43;
  ulong uVar44;
  long lVar45;
  size_type __rlen;
  undefined1 auVar46 [16];
  uchar uVar47;
  uchar uVar48;
  uchar uVar49;
  byte bVar50;
  uchar uVar51;
  uchar uVar52;
  uchar uVar53;
  byte bVar54;
  uchar uVar55;
  uchar uVar56;
  uchar uVar57;
  byte bVar58;
  uchar uVar59;
  uchar uVar60;
  uchar uVar61;
  byte bVar62;
  try_emplace_args_t local_d1;
  __shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2> *local_d0;
  uint64_t local_c8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
  *local_c0;
  size_t pos;
  size_t local_b0;
  ulong local_a8;
  ulong local_a0;
  group_type_pointer local_98;
  value_type *elements;
  uchar local_88;
  uchar uStack_87;
  uchar uStack_86;
  byte bStack_85;
  uchar uStack_84;
  uchar uStack_83;
  uchar uStack_82;
  byte bStack_81;
  uchar uStack_80;
  uchar uStack_7f;
  uchar uStack_7e;
  byte bStack_7d;
  uchar uStack_7c;
  uchar uStack_7b;
  uchar uStack_7a;
  byte bStack_79;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  byte bStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  byte bStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  byte bStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  byte bStack_69;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_void>
  x;
  locator res;
  
  local_c0 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
              *)&this->subroutineNameMap;
  peVar4 = (subroutine->super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  x.val.storage.t_._M_str = (peVar4->name)._M_dataplus._M_p;
  x.val.storage.t_._M_len = (peVar4->name)._M_string_length;
  local_d0 = &subroutine->
              super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>;
  local_c8 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                        local_c0,(basic_string_view<char,_std::char_traits<char>_> *)&x);
  __s1 = x.val.storage.t_._M_str;
  __n = x.val.storage.t_._M_len;
  uVar44 = local_c8 >>
           ((byte)(this->subroutineNameMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  local_98 = (this->subroutineNameMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
             .arrays.groups_;
  lVar45 = (local_c8 & 0xff) * 4;
  uVar47 = (&UNK_00474b6c)[lVar45];
  uVar48 = (&UNK_00474b6d)[lVar45];
  uVar49 = (&UNK_00474b6e)[lVar45];
  bVar50 = (&UNK_00474b6f)[lVar45];
  elements = (this->subroutineNameMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
             .arrays.elements_;
  local_a0 = (ulong)((uint)local_c8 & 7);
  local_b0 = (this->subroutineNameMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
             .arrays.groups_size_mask;
  uVar43 = 0;
  uVar51 = uVar47;
  uVar52 = uVar48;
  uVar53 = uVar49;
  bVar54 = bVar50;
  uVar55 = uVar47;
  uVar56 = uVar48;
  uVar57 = uVar49;
  bVar58 = bVar50;
  uVar59 = uVar47;
  uVar60 = uVar48;
  uVar61 = uVar49;
  bVar62 = bVar50;
  local_a8 = uVar44;
  do {
    pvVar24 = elements;
    pgVar2 = local_98 + uVar44;
    local_78 = pgVar2->m[0].n;
    uStack_77 = pgVar2->m[1].n;
    uStack_76 = pgVar2->m[2].n;
    bStack_75 = pgVar2->m[3].n;
    uStack_74 = pgVar2->m[4].n;
    uStack_73 = pgVar2->m[5].n;
    uStack_72 = pgVar2->m[6].n;
    bStack_71 = pgVar2->m[7].n;
    uStack_70 = pgVar2->m[8].n;
    uStack_6f = pgVar2->m[9].n;
    uStack_6e = pgVar2->m[10].n;
    bStack_6d = pgVar2->m[0xb].n;
    uStack_6c = pgVar2->m[0xc].n;
    uStack_6b = pgVar2->m[0xd].n;
    uStack_6a = pgVar2->m[0xe].n;
    bVar7 = pgVar2->m[0xf].n;
    auVar46[0] = -(local_78 == uVar47);
    auVar46[1] = -(uStack_77 == uVar48);
    auVar46[2] = -(uStack_76 == uVar49);
    auVar46[3] = -(bStack_75 == bVar50);
    auVar46[4] = -(uStack_74 == uVar51);
    auVar46[5] = -(uStack_73 == uVar52);
    auVar46[6] = -(uStack_72 == uVar53);
    auVar46[7] = -(bStack_71 == bVar54);
    auVar46[8] = -(uStack_70 == uVar55);
    auVar46[9] = -(uStack_6f == uVar56);
    auVar46[10] = -(uStack_6e == uVar57);
    auVar46[0xb] = -(bStack_6d == bVar58);
    auVar46[0xc] = -(uStack_6c == uVar59);
    auVar46[0xd] = -(uStack_6b == uVar60);
    auVar46[0xe] = -(uStack_6a == uVar61);
    auVar46[0xf] = -(bVar7 == bVar62);
    pos = uVar44;
    bStack_69 = bVar7;
    uVar25 = uVar47;
    uVar26 = uVar48;
    uVar27 = uVar49;
    bVar28 = bVar50;
    uVar29 = uVar51;
    uVar30 = uVar52;
    uVar31 = uVar53;
    bVar32 = bVar54;
    uVar33 = uVar55;
    uVar34 = uVar56;
    uVar35 = uVar57;
    bVar36 = bVar58;
    uVar37 = uVar59;
    uVar38 = uVar60;
    uVar39 = uVar61;
    bVar40 = bVar62;
    uVar8 = local_88;
    uVar9 = uStack_87;
    uVar10 = uStack_86;
    bVar11 = bStack_85;
    uVar12 = uStack_84;
    uVar13 = uStack_83;
    uVar14 = uStack_82;
    bVar15 = bStack_81;
    uVar16 = uStack_80;
    uVar17 = uStack_7f;
    uVar18 = uStack_7e;
    bVar19 = bStack_7d;
    uVar20 = uStack_7c;
    uVar21 = uStack_7b;
    uVar22 = uStack_7a;
    bVar23 = bStack_79;
    for (uVar42 = (uint)(ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe); bStack_79 = bVar40,
        uStack_7a = uVar39, uStack_7b = uVar38, uStack_7c = uVar37, bStack_7d = bVar36,
        uStack_7e = uVar35, uStack_7f = uVar34, uStack_80 = uVar33, bStack_81 = bVar32,
        uStack_82 = uVar31, uStack_83 = uVar30, uStack_84 = uVar29, bStack_85 = bVar28,
        uStack_86 = uVar27, uStack_87 = uVar26, local_88 = uVar25, uVar42 != 0;
        uVar42 = uVar42 - 1 & uVar42) {
      iVar41 = 0;
      if (uVar42 != 0) {
        for (; (uVar42 >> iVar41 & 1) == 0; iVar41 = iVar41 + 1) {
        }
      }
      if ((__n == *(size_t *)
                   ((long)&pvVar24[uVar44 * 0xf].first._M_len + (ulong)(uint)(iVar41 << 5))) &&
         ((__n == 0 ||
          (iVar41 = bcmp((void *)__s1,
                         *(void **)((long)&pvVar24[uVar44 * 0xf].first._M_str +
                                   (ulong)(uint)(iVar41 << 5)),__n), uVar47 = local_88,
          uVar48 = uStack_87, uVar49 = uStack_86, bVar50 = bStack_85, uVar51 = uStack_84,
          uVar52 = uStack_83, uVar53 = uStack_82, bVar54 = bStack_81, uVar55 = uStack_80,
          uVar56 = uStack_7f, uVar57 = uStack_7e, bVar58 = bStack_7d, uVar59 = uStack_7c,
          uVar60 = uStack_7b, uVar61 = uStack_7a, bVar62 = bStack_79, iVar41 == 0))))
      goto LAB_003e7ab9;
      uVar25 = local_88;
      uVar26 = uStack_87;
      uVar27 = uStack_86;
      bVar28 = bStack_85;
      uVar29 = uStack_84;
      uVar30 = uStack_83;
      uVar31 = uStack_82;
      bVar32 = bStack_81;
      uVar33 = uStack_80;
      uVar34 = uStack_7f;
      uVar35 = uStack_7e;
      bVar36 = bStack_7d;
      uVar37 = uStack_7c;
      uVar38 = uStack_7b;
      uVar39 = uStack_7a;
      bVar40 = bStack_79;
      uVar8 = local_88;
      uVar9 = uStack_87;
      uVar10 = uStack_86;
      bVar11 = bStack_85;
      uVar12 = uStack_84;
      uVar13 = uStack_83;
      uVar14 = uStack_82;
      bVar15 = bStack_81;
      uVar16 = uStack_80;
      uVar17 = uStack_7f;
      uVar18 = uStack_7e;
      bVar19 = bStack_7d;
      uVar20 = uStack_7c;
      uVar21 = uStack_7b;
      uVar22 = uStack_7a;
      bVar23 = bStack_79;
    }
    local_88 = uVar8;
    uStack_87 = uVar9;
    uStack_86 = uVar10;
    bStack_85 = bVar11;
    uStack_84 = uVar12;
    uStack_83 = uVar13;
    uStack_82 = uVar14;
    bStack_81 = bVar15;
    uStack_80 = uVar16;
    uStack_7f = uVar17;
    uStack_7e = uVar18;
    bStack_7d = bVar19;
    uStack_7c = uVar20;
    uStack_7b = uVar21;
    uStack_7a = uVar22;
    bStack_79 = bVar23;
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[local_a0] & bVar7) == 0) break;
    lVar45 = pos + uVar43;
    uVar43 = uVar43 + 1;
    uVar44 = lVar45 + 1U & local_b0;
  } while (uVar43 <= local_b0);
  if ((this->subroutineNameMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
      .size_ctrl.size <
      (this->subroutineNameMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<slang::ast::SystemSubroutine>&>
              (&res,local_c0,(arrays_type *)local_c0,local_a8,local_c8,&local_d1,
               (basic_string_view<char,_std::char_traits<char>_> *)&x,
               (shared_ptr<slang::ast::SystemSubroutine> *)local_d0);
    psVar1 = &(this->subroutineNameMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<slang::ast::SystemSubroutine>&>
              (&res,local_c0,local_c8,&local_d1,
               (basic_string_view<char,_std::char_traits<char>_> *)&x,
               (shared_ptr<slang::ast::SystemSubroutine> *)local_d0);
  }
LAB_003e7ab9:
  peVar4 = local_d0->_M_ptr;
  p_Var5 = (local_d0->_M_refcount)._M_pi;
  KVar3 = peVar4->knownNameId;
  psVar6 = (this->systemSubroutines).
           super__Vector_base<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_d0->_M_ptr = (element_type *)0x0;
  local_d0->_M_refcount = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  psVar6[(int)KVar3].super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar4;
  this_00 = psVar6[(int)KVar3].
            super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  psVar6[(int)KVar3].super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void addSystemSubroutine(std::shared_ptr<SystemSubroutine> subroutine) {
        SLANG_ASSERT(subroutine->knownNameId != KnownSystemName::Unknown);
        SLANG_ASSERT(!systemSubroutines[(size_t)subroutine->knownNameId]);
        subroutineNameMap.emplace(subroutine->name, subroutine);
        systemSubroutines[(size_t)subroutine->knownNameId] = std::move(subroutine);
    }